

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_size_varlen64(stb_uint64 v)

{
  stb_uint64 v_local;
  
  if (v < 0x80) {
    v_local._4_4_ = 1;
  }
  else if (v < 0x4000) {
    v_local._4_4_ = 2;
  }
  else if (v < 0x200000) {
    v_local._4_4_ = 3;
  }
  else if (v < 0x10000000) {
    v_local._4_4_ = 4;
  }
  else if (v < 0x800000000) {
    v_local._4_4_ = 5;
  }
  else if (v < 0x40000000000) {
    v_local._4_4_ = 6;
  }
  else if (v < 0x2000000000000) {
    v_local._4_4_ = 7;
  }
  else if (v < 0x100000000000000) {
    v_local._4_4_ = 8;
  }
  else {
    v_local._4_4_ = 9;
  }
  return v_local._4_4_;
}

Assistant:

int stb_size_varlen64(stb_uint64 v)
{
   if (v < 0x00000080) return 1;
   if (v < 0x00004000) return 2;
   if (v < 0x00200000) return 3;
   if (v < 0x10000000) return 4;
   if (v < STB_IMM_UINT64(0x0000000800000000)) return 5;
   if (v < STB_IMM_UINT64(0x0000040000000000)) return 6;
   if (v < STB_IMM_UINT64(0x0002000000000000)) return 7;
   if (v < STB_IMM_UINT64(0x0100000000000000)) return 8; 
   return 9;
}